

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O2

ssize_t __thiscall UniValue::write_abi_cxx11_(UniValue *this,int __fd,void *__buf,size_t __n)

{
  uint indentLevel;
  undefined4 in_register_00000034;
  UniValue *this_00;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (UniValue *)CONCAT44(in_register_00000034,__fd);
  *(size_type **)this = &(this->val)._M_string_length;
  (this->val)._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&(this->val)._M_string_length = 0;
  std::__cxx11::string::reserve((ulong)this);
  indentLevel = (int)__n + (uint)((int)__n == 0);
  switch(this_00->typ) {
  case VNULL:
    goto LAB_0010ab1e;
  case VOBJ:
    writeObject(this_00,(uint)__buf,indentLevel,(string *)this);
    break;
  case VARR:
    writeArray(this_00,(uint)__buf,indentLevel,(string *)this);
    break;
  case VSTR:
    json_escape(&local_80,&this_00->val);
    std::operator+(&local_60,"\"",&local_80);
    std::operator+(&local_40,&local_60,"\"");
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    break;
  case VNUM:
    std::__cxx11::string::append((string *)this);
    break;
  case VBOOL:
    std::operator==(&this_00->val,"1");
LAB_0010ab1e:
    std::__cxx11::string::append((char *)this);
  }
  return (ssize_t)this;
}

Assistant:

std::string UniValue::write(unsigned int prettyIndent,
                            unsigned int indentLevel) const
{
    std::string s;
    s.reserve(1024);

    unsigned int modIndent = indentLevel;
    if (modIndent == 0)
        modIndent = 1;

    switch (typ) {
    case VNULL:
        s += "null";
        break;
    case VOBJ:
        writeObject(prettyIndent, modIndent, s);
        break;
    case VARR:
        writeArray(prettyIndent, modIndent, s);
        break;
    case VSTR:
        s += "\"" + json_escape(val) + "\"";
        break;
    case VNUM:
        s += val;
        break;
    case VBOOL:
        s += (val == "1" ? "true" : "false");
        break;
    }

    return s;
}